

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void var_filter_block2d_bil_first_pass_c
               (uint8_t *a,uint16_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  undefined4 in_register_0000008c;
  uint uVar1;
  ulong uVar2;
  
  for (uVar1 = 0; uVar1 != pixel_step; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; output_height != uVar2; uVar2 = uVar2 + 1) {
      b[uVar2] = (uint16_t)
                 ((uint)*(byte *)CONCAT44(in_register_0000008c,output_width) * (uint)a[uVar2] +
                  (uint)*(byte *)(CONCAT44(in_register_0000008c,output_width) + 1) *
                  (uint)a[uVar2 + 1] + 0x40 >> 7);
    }
    a = a + uVar2 + (src_pixels_per_line - output_height);
    b = b + output_height;
  }
  return;
}

Assistant:

static void var_filter_block2d_bil_first_pass_c(
    const uint8_t *a, uint16_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; ++j) {
      b[j] = ROUND_POWER_OF_TWO(
          (int)a[0] * filter[0] + (int)a[pixel_step] * filter[1], FILTER_BITS);

      ++a;
    }

    a += src_pixels_per_line - output_width;
    b += output_width;
  }
}